

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextobject.cpp
# Opt level: O0

void __thiscall QTextFramePrivate::remove_me(QTextFramePrivate *this)

{
  long lVar1;
  QList<QTextFrame_*> *this_00;
  qsizetype qVar2;
  const_reference ppQVar3;
  QTextFramePrivate *pQVar4;
  QTextFramePrivate *in_RDI;
  long in_FS_OFFSET;
  QTextFrame *c;
  int i;
  int index;
  QTextFrame *q;
  QTextFrame *in_stack_ffffffffffffffb8;
  QListSpecialMethodsBase<QTextFrame_*> *in_stack_ffffffffffffffc0;
  QTextDocumentPrivate *in_stack_ffffffffffffffd0;
  QTextFrame *t;
  int local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  if (((*(int *)&(in_RDI->super_QTextObjectPrivate).field_0x84 == 0) && (in_RDI->fragment_end == 0))
     && (in_RDI->parentFrame == (QTextFrame *)0x0)) {
    QTextObject::document((QTextObject *)0x88c777);
    QTextDocumentPrivate::get((QTextDocument *)0x88c77f);
    QTextDocumentPrivate::deleteObject(in_stack_ffffffffffffffd0,(QTextObject *)in_RDI);
  }
  else if (in_RDI->parentFrame != (QTextFrame *)0x0) {
    QTextFrame::d_func((QTextFrame *)0x88c7b6);
    QListSpecialMethodsBase<QTextFrame*>::indexOf<QTextFrame*>
              (in_stack_ffffffffffffffc0,(QTextFrame **)in_stack_ffffffffffffffb8,0x88c7ce);
    local_20 = 0;
    while( true ) {
      this_00 = (QList<QTextFrame_*> *)(long)local_20;
      qVar2 = QList<QTextFrame_*>::size(&in_RDI->childFrames);
      if (qVar2 <= (long)this_00) break;
      ppQVar3 = QList<QTextFrame_*>::at(this_00,(qsizetype)in_stack_ffffffffffffffb8);
      t = *ppQVar3;
      QTextFrame::d_func((QTextFrame *)0x88c838);
      QList<QTextFrame_*>::insert((QList<QTextFrame_*> *)in_RDI,(qsizetype)this_00,t);
      in_stack_ffffffffffffffb8 = in_RDI->parentFrame;
      pQVar4 = QTextFrame::d_func((QTextFrame *)0x88c873);
      pQVar4->parentFrame = in_stack_ffffffffffffffb8;
      local_20 = local_20 + 1;
    }
    QTextFrame::d_func((QTextFrame *)0x88c8aa);
    QList<QTextFrame_*>::removeAt(this_00,(qsizetype)in_stack_ffffffffffffffb8);
    QList<QTextFrame_*>::clear(this_00);
    in_RDI->parentFrame = (QTextFrame *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextFramePrivate::remove_me()
{
    Q_Q(QTextFrame);
    if (fragment_start == 0 && fragment_end == 0
        && !parentFrame) {
        QTextDocumentPrivate::get(q->document())->deleteObject(q);
        return;
    }

    if (!parentFrame)
        return;

    int index = parentFrame->d_func()->childFrames.indexOf(q);

    // iterator over all children and move them to the parent
    for (int i = 0; i < childFrames.size(); ++i) {
        QTextFrame *c = childFrames.at(i);
        parentFrame->d_func()->childFrames.insert(index, c);
        c->d_func()->parentFrame = parentFrame;
        ++index;
    }
    Q_ASSERT(parentFrame->d_func()->childFrames.at(index) == q);
    parentFrame->d_func()->childFrames.removeAt(index);

    childFrames.clear();
    parentFrame = nullptr;
}